

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha384-512.c
# Opt level: O0

int SHA512Input(SHA512Context *context,uint8_t *message_array,uint length)

{
  uint8_t uVar1;
  short sVar2;
  ulong uVar3;
  uint64_t uVar4;
  ulong uVar5;
  bool bVar6;
  uint64_t addTemp;
  uint8_t *puStack_20;
  uint length_local;
  uint8_t *message_array_local;
  SHA512Context *context_local;
  
  if (length == 0) {
    context_local._4_4_ = 0;
  }
  else if (length < 0x81) {
    if ((context == (SHA512Context *)0x0) || (message_array == (uint8_t *)0x0)) {
      context_local._4_4_ = 1;
    }
    else if (context->Computed == 0) {
      addTemp._4_4_ = length;
      puStack_20 = message_array;
      if (context->Corrupted == 0) {
        while( true ) {
          bVar6 = false;
          if (addTemp._4_4_ != 0) {
            bVar6 = context->Corrupted == 0;
          }
          if (!bVar6) break;
          if (context->Message_Block_Index < 0x80) {
            uVar1 = *puStack_20;
            sVar2 = context->Message_Block_Index;
            context->Message_Block_Index = sVar2 + 1;
            context->Message_Block[sVar2] = uVar1;
            uVar3 = context->Length_Low;
            uVar5 = context->Length_Low + 8;
            context->Length_Low = uVar5;
            bVar6 = false;
            if (uVar5 < uVar3) {
              uVar4 = context->Length_High + 1;
              context->Length_High = uVar4;
              bVar6 = uVar4 == 0;
            }
            context->Corrupted = (uint)bVar6;
            if ((bVar6 == 0) && (context->Message_Block_Index == 0x80)) {
              SHA384_512ProcessMessageBlock(context);
            }
            puStack_20 = puStack_20 + 1;
            addTemp._4_4_ = addTemp._4_4_ - 1;
          }
          else {
            context->Corrupted = 4;
            addTemp._4_4_ = addTemp._4_4_ - 1;
          }
        }
        context_local._4_4_ = context->Corrupted;
      }
      else {
        context_local._4_4_ = context->Corrupted;
      }
    }
    else {
      context->Corrupted = 3;
      context_local._4_4_ = 3;
    }
  }
  else {
    context_local._4_4_ = 4;
  }
  return context_local._4_4_;
}

Assistant:

int SHA512Input(SHA512Context *context,
    const uint8_t *message_array,
    unsigned int length)
{
    uint64_t addTemp;
    if (!length)
        return shaSuccess;
    
    if (length > (sizeof(context->Message_Block) / sizeof(context->Message_Block[0])))
        return shaBadParam;

    if (!context || !message_array)
        return shaNull;

    if (context->Computed) {
        context->Corrupted = shaStateError;
        return shaStateError;
    }

    if (context->Corrupted)
        return context->Corrupted;

    while (length-- && !context->Corrupted) {
        if (context->Message_Block_Index < SHA512_Message_Block_Size)
        {
            context->Message_Block[context->Message_Block_Index++] =
                (*message_array & 0xFF);

            if (!SHA384_512AddLength(context, 8) &&
                (context->Message_Block_Index == SHA512_Message_Block_Size))
                SHA384_512ProcessMessageBlock(context);

            message_array++;
        }
        else
        {
            context->Corrupted = shaBadParam;
        }
    }

    return context->Corrupted;
}